

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O2

int mbedtls_ecp_gen_keypair
              (mbedtls_ecp_group *grp,mbedtls_mpi *d,mbedtls_ecp_point *Q,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  size_t sVar2;
  size_t count;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  bool bVar6;
  uchar rnd [66];
  
  if ((grp->G).X.p == (mbedtls_mpi_uint *)0x0) {
    return -0x4f80;
  }
  uVar5 = grp->nbits + 7;
  uVar3 = uVar5 >> 3;
  if ((grp->G).Y.p == (mbedtls_mpi_uint *)0x0) {
    iVar1 = mbedtls_mpi_fill_random(d,uVar3,f_rng,p_rng);
    if (iVar1 != 0) {
      return iVar1;
    }
    sVar2 = mbedtls_mpi_bitlen(d);
    uVar3 = grp->nbits;
    count = (sVar2 - 1) - uVar3;
    if (sVar2 - 1 < uVar3 || count == 0) {
      iVar1 = mbedtls_mpi_set_bit(d,uVar3,'\x01');
    }
    else {
      iVar1 = mbedtls_mpi_shift_r(d,count);
    }
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = mbedtls_mpi_set_bit(d,0,'\0');
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = mbedtls_mpi_set_bit(d,1,'\0');
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = mbedtls_mpi_set_bit(d,2,'\0');
  }
  else {
    iVar4 = 0x1e;
    do {
      iVar1 = (*f_rng)(p_rng,rnd,uVar3);
      if (((iVar1 != 0) || (iVar1 = mbedtls_mpi_read_binary(d,rnd,uVar3), iVar1 != 0)) ||
         (iVar1 = mbedtls_mpi_shift_r(d,(uVar5 & 0xfffffffffffffff8) - grp->nbits), iVar1 != 0))
      goto LAB_0015431a;
      bVar6 = iVar4 == 0;
      iVar4 = iVar4 + -1;
      if (bVar6) {
        return -0x4d00;
      }
      iVar1 = mbedtls_mpi_cmp_int(d,1);
    } while ((iVar1 < 0) || (iVar1 = mbedtls_mpi_cmp_mpi(d,&grp->N), -1 < iVar1));
    iVar1 = 0;
  }
LAB_0015431a:
  if (iVar1 == 0) {
    iVar1 = mbedtls_ecp_mul(grp,Q,d,&grp->G,f_rng,p_rng);
  }
  return iVar1;
}

Assistant:

int mbedtls_ecp_gen_keypair( mbedtls_ecp_group *grp, mbedtls_mpi *d, mbedtls_ecp_point *Q,
                     int (*f_rng)(void *, unsigned char *, size_t),
                     void *p_rng )
{
    int ret;
    size_t n_size = ( grp->nbits + 7 ) / 8;

#if defined(ECP_MONTGOMERY)
    if( ecp_get_type( grp ) == ECP_TYPE_MONTGOMERY )
    {
        /* [M225] page 5 */
        size_t b;

        MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( d, n_size, f_rng, p_rng ) );

        /* Make sure the most significant bit is nbits */
        b = mbedtls_mpi_bitlen( d ) - 1; /* mbedtls_mpi_bitlen is one-based */
        if( b > grp->nbits )
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( d, b - grp->nbits ) );
        else
            MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( d, grp->nbits, 1 ) );

        /* Make sure the last three bits are unset */
        MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( d, 0, 0 ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( d, 1, 0 ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( d, 2, 0 ) );
    }
    else
#endif /* ECP_MONTGOMERY */
#if defined(ECP_SHORTWEIERSTRASS)
    if( ecp_get_type( grp ) == ECP_TYPE_SHORT_WEIERSTRASS )
    {
        /* SEC1 3.2.1: Generate d such that 1 <= n < N */
        int count = 0;
        unsigned char rnd[MBEDTLS_ECP_MAX_BYTES];

        /*
         * Match the procedure given in RFC 6979 (deterministic ECDSA):
         * - use the same byte ordering;
         * - keep the leftmost nbits bits of the generated octet string;
         * - try until result is in the desired range.
         * This also avoids any biais, which is especially important for ECDSA.
         */
        do
        {
            MBEDTLS_MPI_CHK( f_rng( p_rng, rnd, n_size ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_read_binary( d, rnd, n_size ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( d, 8 * n_size - grp->nbits ) );

            /*
             * Each try has at worst a probability 1/2 of failing (the msb has
             * a probability 1/2 of being 0, and then the result will be < N),
             * so after 30 tries failure probability is a most 2**(-30).
             *
             * For most curves, 1 try is enough with overwhelming probability,
             * since N starts with a lot of 1s in binary, but some curves
             * such as secp224k1 are actually very close to the worst case.
             */
            if( ++count > 30 )
                return( MBEDTLS_ERR_ECP_RANDOM_FAILED );
        }
        while( mbedtls_mpi_cmp_int( d, 1 ) < 0 ||
               mbedtls_mpi_cmp_mpi( d, &grp->N ) >= 0 );
    }
    else
#endif /* ECP_SHORTWEIERSTRASS */
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

cleanup:
    if( ret != 0 )
        return( ret );

    return( mbedtls_ecp_mul( grp, Q, d, &grp->G, f_rng, p_rng ) );
}